

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void sockaddr_to_string(char *buf,size_t len,usa *usa)

{
  usa *usa_local;
  size_t len_local;
  char *buf_local;
  
  *buf = '\0';
  if (usa != (usa *)0x0) {
    if ((usa->sa).sa_family == 2) {
      getnameinfo((sockaddr *)&usa->sa,0x10,buf,(socklen_t)len,(char *)0x0,0,1);
    }
    else if ((usa->sa).sa_family == 10) {
      getnameinfo((sockaddr *)&usa->sa,0x1c,buf,(socklen_t)len,(char *)0x0,0,1);
    }
  }
  return;
}

Assistant:

static void
sockaddr_to_string(char *buf, size_t len, const union usa *usa)
{
	buf[0] = '\0';

	if (!usa) {
		return;
	}

	if (usa->sa.sa_family == AF_INET) {
		getnameinfo(&usa->sa,
		            sizeof(usa->sin),
		            buf,
		            (unsigned)len,
		            NULL,
		            0,
		            NI_NUMERICHOST);
	}
#if defined(USE_IPV6)
	else if (usa->sa.sa_family == AF_INET6) {
		getnameinfo(&usa->sa,
		            sizeof(usa->sin6),
		            buf,
		            (unsigned)len,
		            NULL,
		            0,
		            NI_NUMERICHOST);
	}
#endif
#if defined(USE_X_DOM_SOCKET)
	else if (usa->sa.sa_family == AF_UNIX) {
		/* TODO: Define a remote address for unix domain sockets.
		* This code will always return "localhost", identical to http+tcp:
		getnameinfo(&usa->sa,
		sizeof(usa->sun),
		buf,
		(unsigned)len,
		NULL,
		0,
		NI_NUMERICHOST);
		*/
		mg_strlcpy(buf, UNIX_DOMAIN_SOCKET_SERVER_NAME, len);
	}
#endif
}